

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_queue_tail_single.h
# Opt level: O0

void density::detail::swap
               (LFQueue_Tail<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
                *i_first,
               LFQueue_Tail<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
               *i_second)

{
  __pointer_type __p;
  __pointer_type __p_00;
  __pointer_type tmp1;
  LFQueue_Tail<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
  *i_second_local;
  LFQueue_Tail<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
  *i_first_local;
  
  swap((LFQueue_Base<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>,_density::detail::LFQueue_Tail<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
        *)i_first,
       (LFQueue_Base<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>,_density::detail::LFQueue_Tail<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
        *)i_second);
  std::swap<unsigned_long>(&i_first->m_tail,&i_second->m_tail);
  __p = std::atomic<density::detail::LfQueueControl_*>::load
                  (&i_second->m_initial_page,memory_order_seq_cst);
  __p_00 = std::atomic<density::detail::LfQueueControl_*>::load
                     (&i_first->m_initial_page,memory_order_seq_cst);
  std::atomic<density::detail::LfQueueControl_*>::store
            (&i_second->m_initial_page,__p_00,memory_order_seq_cst);
  std::atomic<density::detail::LfQueueControl_*>::store
            (&i_first->m_initial_page,__p,memory_order_seq_cst);
  return;
}

Assistant:

void swap(LFQueue_Tail & i_first, LFQueue_Tail & i_second) noexcept
            {
                // swap the base
                swap(static_cast<Base &>(i_first), static_cast<Base &>(i_second));

                // swap m_tail
                std::swap(i_first.m_tail, i_second.m_tail);

                // swap m_initial_page
                auto const tmp1 = i_second.m_initial_page.load();
                i_second.m_initial_page.store(i_first.m_initial_page.load());
                i_first.m_initial_page.store(tmp1);
            }